

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

int64_t pick_interinter_wedge
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                  int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint32_t n;
  AV1_COMP *pAVar4;
  int8_t iVar5;
  int64_t iVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  int iVar10;
  undefined7 in_register_00000011;
  uint8_t *puVar11;
  uint cols;
  ulong uVar12;
  long lVar13;
  long lVar14;
  char cVar15;
  bool bVar16;
  int rate;
  int64_t dist;
  uint32_t esq [2] [2];
  uint64_t *best_sse_00;
  int64_t *dist_00;
  char local_80ea;
  int8_t local_80e9;
  uint8_t *local_80e8;
  ulong local_80e0;
  undefined4 local_80d8;
  int local_80d4;
  undefined8 local_80d0;
  uint8_t *local_80c8;
  ulong local_80c0;
  long *local_80b8;
  ulong local_80b0;
  uint8_t *local_80a8;
  AV1_COMP *local_80a0;
  uint local_8094;
  int16_t *local_8090;
  int (*local_8088) [16];
  MB_MODE_INFO *local_8080;
  long local_8078;
  long local_8070;
  long local_8068;
  uint local_8060;
  uint local_805c;
  uint local_8058;
  uint local_8054 [8201];
  
  local_8080 = *(x->e_mbd).mi;
  iVar10 = (int)CONCAT71(in_register_00000011,bsize);
  local_80e0 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar2 = block_size_wide[local_80e0];
  local_80b0 = (ulong)bVar2;
  local_80e9 = -1;
  local_80c0 = CONCAT44(local_80c0._4_4_,iVar10);
  local_80a0 = (AV1_COMP *)x;
  local_8090 = residual1;
  if ((cpi->sf).inter_sf.fast_wedge_sign_estimate == 0) {
    bVar3 = block_size_high[local_80e0];
    cols = (uint)bVar2;
    local_80c8 = (uint8_t *)CONCAT44(local_80c8._4_4_,bVar3 * cols);
    local_80e8 = (uint8_t *)
                 CONCAT44(local_80e8._4_4_,
                          *(undefined4 *)
                           ((long)&av1_wedge_params_lookup[0].wedge_types +
                           (ulong)(uint)(iVar10 << 5)));
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      (*aom_subtract_block)
                ((int)bVar3,cols,(int16_t *)&local_8060,local_80b0,x->plane[0].src.buf,
                 (long)x->plane[0].src.stride,p0,local_80b0);
      local_80d0 = (ulong)local_80d0._4_4_ << 0x20;
    }
    else {
      local_80d0 = CONCAT44(local_80d0._4_4_,(x->e_mbd).bd * 2 + -0x10);
      aom_highbd_subtract_block_sse2
                ((uint)bVar3,cols,(int16_t *)&local_8060,(ulong)cols,x->plane[0].src.buf,
                 (long)x->plane[0].src.stride,(uint8_t *)((ulong)p0 >> 1),(ulong)cols);
    }
    n = (uint32_t)local_80c8;
    uVar7 = aom_sum_squares_i16_sse2((int16_t *)&local_8060,(uint32_t)local_80c8);
    uVar8 = aom_sum_squares_i16_sse2(residual1,n);
    local_80b0 = (uVar7 - uVar8) * 0x20;
    (*av1_wedge_compute_delta_squares)((int16_t *)&local_8060,(int16_t *)&local_8060,residual1,n);
    puVar11 = local_80c8;
    local_80a8 = (uint8_t *)CONCAT44(local_80a8._4_4_,(int)(char)local_80e8);
    local_80b8 = (long *)((long)&av1_wedge_params_lookup[0].masks +
                         (ulong)(uint)((int)local_80e0 << 5));
    local_8070 = (long)((1 << ((byte)local_80d0 & 0x1f)) >> 1);
    local_80d0 = local_80d0 & 0xffffffff;
    local_8088 = (x->mode_costs).wedge_idx_cost;
    uVar9 = 0x7fffffffffffffff;
    local_80ea = -1;
    local_80d8 = 0;
    local_8094 = (uint)(byte)local_80c0;
    local_8078 = (long)*local_8088 + (ulong)(uint)((int)local_80e0 << 6);
    for (cVar15 = '\0'; cVar15 < (int)local_80a8; cVar15 = cVar15 + '\x01') {
      lVar13 = *local_80b8;
      lVar14 = (long)cVar15;
      iVar10 = (int)puVar11;
      local_80c0 = uVar9;
      iVar5 = (*av1_wedge_sign_from_residuals)
                        ((int16_t *)&local_8060,*(uint8_t **)(lVar13 + lVar14 * 8),iVar10,local_80b0
                        );
      local_80e8 = (uint8_t *)CONCAT71(local_80e8._1_7_,iVar5);
      dist_00 = (int64_t *)0x34ac63;
      uVar7 = (*av1_wedge_sse_from_residuals)
                        (residual1,diff10,*(uint8_t **)((long)iVar5 * 0x80 + lVar13 + lVar14 * 8),
                         iVar10);
      pAVar4 = local_80a0;
      uVar12 = uVar7 + local_8070 >> ((byte)local_80d0 & 0x3f);
      model_rd_with_curvfit
                (local_80a0,(MACROBLOCK *)(ulong)local_8094,BLOCK_4X4,(int)uVar12,
                 (ulong)puVar11 & 0xffffffff,(int)&local_80d4,(int *)&local_8068,dist_00);
      lVar13 = (long)local_80d4 + (long)*(int *)(local_8078 + lVar14 * 4);
      local_80d4 = (int)lVar13;
      lVar13 = local_8068 * 0x80 +
               (*(int *)((pAVar4->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) * lVar13 +
                0x100 >> 9);
      uVar9 = local_80c0;
      if (lVar13 < (long)local_80c0) {
        *best_sse = uVar12;
        local_80d8 = (undefined4)CONCAT71((int7)(local_80c0 >> 8),(char)local_80e8);
        uVar9 = lVar13;
        local_80ea = cVar15;
      }
      residual1 = local_8090;
    }
    iVar6 = uVar9 - ((long)*(int *)((local_80a0->enc_quant_dequant_params).quants.y_quant_fp[0x20] +
                                   4) *
                     (long)*(int *)((long)*local_8088 +
                                   (long)local_80ea * 4 + (ulong)(uint)((int)local_80e0 << 6)) +
                     0x100 >> 9);
    iVar5 = (int8_t)local_80d8;
    local_80e9 = local_80ea;
  }
  else {
    local_80e8 = x->plane[0].src.buf;
    iVar10 = x->plane[0].src.stride;
    bVar16 = (((x->e_mbd).cur_buf)->flags & 8) == 0;
    bVar3 = block_size_high[local_80e0];
    local_80c8 = (uint8_t *)((ulong)p1 >> 1);
    if (bVar16) {
      local_80c8 = p1;
    }
    pbVar1 = estimate_wedge_sign_split_qtr + local_80e0;
    puVar11 = (uint8_t *)((ulong)p0 >> 1);
    if (bVar16) {
      puVar11 = p0;
    }
    local_80e0 = (ulong)*pbVar1 * 0x70;
    (*cpi->ppi->fn_ptr[*pbVar1].vf)(local_80e8,iVar10,puVar11,(int)bVar2,&local_8060);
    uVar12 = local_80b0;
    uVar9 = local_80e0;
    local_80a8 = local_80e8 + (ulong)(bVar2 >> 1) + (long)(int)(iVar10 * (uint)(bVar3 >> 1));
    lVar13 = (ulong)((uint)(bVar3 >> 1) * (int)local_80b0) + (ulong)(bVar2 >> 1);
    local_80b8 = (long *)CONCAT44(local_80b8._4_4_,iVar10);
    (**(code **)((long)&cpi->ppi->fn_ptr[0].vf + local_80e0))
              (local_80a8,iVar10,puVar11 + lVar13,local_80b0,&local_805c);
    puVar11 = local_80c8;
    (**(code **)((long)&cpi->ppi->fn_ptr[0].vf + uVar9))
              (local_80e8,iVar10,local_80c8,uVar12 & 0xffffffff,&local_8058);
    best_sse_00 = (uint64_t *)0x34aa3e;
    (**(code **)((long)&cpi->ppi->fn_ptr[0].vf + uVar9))
              (local_80a8,(ulong)local_80b8 & 0xffffffff,puVar11 + lVar13,uVar12 & 0xffffffff,
               local_8054);
    iVar5 = (ulong)local_805c + (ulong)local_8058 < (ulong)local_8054[0] + (ulong)local_8060;
    iVar6 = pick_wedge_fixed_sign
                      (local_80a0,(MACROBLOCK *)(local_80c0 & 0xff),(BLOCK_SIZE)local_8090,diff10,
                       (int16_t *)(ulong)(byte)iVar5,(int8_t)&local_80e9,(int8_t *)best_sse,
                       best_sse_00);
  }
  (local_8080->interinter_comp).wedge_sign = iVar5;
  (local_8080->interinter_comp).wedge_index = local_80e9;
  return iVar6;
}

Assistant:

static int64_t pick_interinter_wedge(
    const AV1_COMP *const cpi, MACROBLOCK *const x, const BLOCK_SIZE bsize,
    const uint8_t *const p0, const uint8_t *const p1,
    const int16_t *const residual1, const int16_t *const diff10,
    uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];

  int64_t rd;
  int8_t wedge_index = -1;
  int8_t wedge_sign = 0;

  assert(is_interinter_compound_used(COMPOUND_WEDGE, bsize));
  assert(cpi->common.seq_params->enable_masked_compound);

  if (cpi->sf.inter_sf.fast_wedge_sign_estimate) {
    wedge_sign = estimate_wedge_sign(cpi, x, bsize, p0, bw, p1, bw);
    rd = pick_wedge_fixed_sign(cpi, x, bsize, residual1, diff10, wedge_sign,
                               &wedge_index, best_sse);
  } else {
    rd = pick_wedge(cpi, x, bsize, p0, residual1, diff10, &wedge_sign,
                    &wedge_index, best_sse);
  }

  mbmi->interinter_comp.wedge_sign = wedge_sign;
  mbmi->interinter_comp.wedge_index = wedge_index;
  return rd;
}